

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

string * google::MakeCheckOpString<void_const*,void*>(void **v1,void **v2,char *exprtext)

{
  string *this;
  CheckOpMessageBuilder comb;
  void **in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  CheckOpMessageBuilder *this_00;
  char *in_stack_ffffffffffffffc8;
  CheckOpMessageBuilder *in_stack_ffffffffffffffd0;
  CheckOpMessageBuilder local_20 [4];
  
  this_00 = local_20;
  base::CheckOpMessageBuilder::CheckOpMessageBuilder
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  base::CheckOpMessageBuilder::ForVar1(this_00);
  MakeCheckOpValueString<void_const*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  base::CheckOpMessageBuilder::ForVar2((CheckOpMessageBuilder *)in_stack_ffffffffffffffb0);
  MakeCheckOpValueString<void*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = base::CheckOpMessageBuilder::NewString_abi_cxx11_(this_00);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder((CheckOpMessageBuilder *)this);
  return this;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2, const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}